

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O2

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::serializer<pstore::index::details::empty_class,void>::
write<pstore::serialize::archive::database_writer&>(database_writer *archive,value_type *param_2)

{
  result_type rVar1;
  span<const_unsigned_char,__1L> sp;
  uint8_t dummy;
  uchar local_9;
  
  local_9 = '\0';
  sp = gsl::make_span<unsigned_char_const>(&local_9,&local_9);
  rVar1 = serialize::archive::
          writer_base<pstore::serialize::archive::details::database_writer_policy>::
          putn<pstore::gsl::span<unsigned_char_const,_1l>>
                    (&archive->
                      super_writer_base<pstore::serialize::archive::details::database_writer_policy>
                     ,sp);
  return (archive_result_type<pstore::serialize::archive::database_writer_&>)rVar1.a_;
}

Assistant:

static auto write (Archive && archive, value_type const &)
                -> archive_result_type<Archive> {
                // Tell the archiver to write an array of 0 elements. This should write
                // nothing at all but yield the location at which it would have gone (with the
                // correct type).
                auto const dummy = std::uint8_t{0};
                return serialize::write (std::forward<Archive> (archive),
                                         gsl::make_span (&dummy, &dummy));
            }